

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::trace_proof(Solver *this,char *path)

{
  State *pSVar1;
  ssize_t sVar2;
  size_t __n;
  Solver *in_RSI;
  Solver *in_RDI;
  byte bVar3;
  bool res;
  File *internal_file;
  File *in_stack_00000058;
  Internal *in_stack_00000060;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call(in_RSI,in_stack_ffffffffffffffe8,
                   (char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  require_solver_pointer_to_be_non_zero
            ((void *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             &in_RDI->adding_clause,(char *)0xe1f957);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if (*pSVar1 != CONFIGURING) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"can only start proof tracing to \'%s\' right after initialization",in_RSI);
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  sVar2 = File::write((int)in_RDI->internal,in_RSI,__n);
  bVar3 = sVar2 != 0;
  Internal::trace(in_stack_00000060,in_stack_00000058);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Solver::trace_proof (const char *path) {
  TRACE ("trace_proof", path);
  REQUIRE_VALID_STATE ();
  REQUIRE (
      state () == CONFIGURING,
      "can only start proof tracing to '%s' right after initialization",
      path);
  File *internal_file = File::write (internal, path);
  bool res = (internal_file != 0);
  internal->trace (internal_file);
  LOG_API_CALL_RETURNS ("trace_proof", path, res);
  return res;
}